

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPIToolchains.cxx
# Opt level: O3

Value * cmFileAPIToolchainsDump
                  (Value *__return_storage_ptr__,cmFileAPI *fileAPI,unsigned_long version)

{
  undefined8 *puVar1;
  int iVar2;
  Value *pVVar3;
  allocator_type *__a;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  vector<(anonymous_namespace)::ToolchainVariable,_std::allocator<(anonymous_namespace)::ToolchainVariable>_>
  *in_R8;
  long lVar4;
  cmMakefile *mf;
  initializer_list<(anonymous_namespace)::ToolchainVariable> __l;
  initializer_list<(anonymous_namespace)::ToolchainVariable> __l_00;
  undefined1 local_1c0 [32];
  _Alloc_hider local_1a0;
  size_type local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  bool local_180;
  undefined2 *local_178;
  undefined8 local_170;
  undefined2 local_168;
  undefined1 uStack_166;
  undefined4 uStack_165;
  undefined1 uStack_161;
  undefined7 uStack_160;
  undefined1 local_159;
  undefined7 *local_158;
  undefined8 local_150;
  undefined7 local_148;
  undefined4 uStack_141;
  undefined1 local_13d;
  undefined1 local_138;
  undefined4 *local_130;
  undefined8 local_128;
  undefined4 local_120;
  undefined3 uStack_11c;
  undefined1 local_119;
  undefined1 *local_110 [2];
  undefined1 local_100 [16];
  undefined1 local_f0;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [6];
  undefined1 uStack_d2;
  undefined1 local_cb;
  undefined7 *local_c8;
  undefined8 local_c0;
  undefined7 local_b8;
  undefined1 uStack_b1;
  undefined7 uStack_b0;
  undefined2 local_a9;
  cmMakefile *local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  Value local_80;
  
  Json::Value::Value(__return_storage_ptr__,objectValue);
  Json::Value::Value(&local_80,arrayValue);
  cmState::GetEnabledLanguages_abi_cxx11_
            (&local_98,
             (fileAPI->CMakeInstance->State)._M_t.
             super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  local_a0 = (cmMakefile *)
             local_98.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    mf = (cmMakefile *)
         local_98.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (((anonymous_namespace)::Toolchains::DumpToolchain(std::__cxx11::string_const&)::
           CompilerVariables == '\0') &&
         (iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::Toolchains::
                                       DumpToolchain(std::__cxx11::string_const&)::CompilerVariables
                                     ), iVar2 != 0)) {
        local_1c0._0_8_ = local_1c0 + 0x10;
        local_1c0._16_4_ = 0x68746170;
        local_1c0._8_8_ = 4;
        local_1c0[0x14] = '\0';
        local_1a0._M_p = (pointer)&local_190;
        local_190._M_allocated_capacity = 0x52454c49504d4f43;
        local_198 = 8;
        local_190._M_local_buf[8] = '\0';
        local_180 = false;
        local_178 = &local_168;
        local_168 = 0x6469;
        local_170 = 2;
        uStack_166 = 0;
        local_158 = &local_148;
        local_148 = 0x454c49504d4f43;
        uStack_141 = 0x44495f52;
        local_150 = 0xb;
        local_13d = 0;
        local_138 = 0;
        uStack_11c = 0x6e6f69;
        local_120 = 0x73726576;
        local_128 = 7;
        local_119 = 0;
        local_130 = &local_120;
        local_110[0] = local_100;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"COMPILER_VERSION","");
        local_f0 = 0;
        local_e0 = 6;
        uStack_d2 = 0;
        uStack_b0 = 0x5445475241545f;
        local_b8 = 0x454c49504d4f43;
        uStack_b1 = 0x52;
        local_c0 = 0xf;
        local_a9 = 0;
        __l._M_len = extraout_RDX;
        __l._M_array = (iterator)local_1c0;
        local_e8 = local_d8;
        local_c8 = &local_b8;
        std::
        vector<(anonymous_namespace)::ToolchainVariable,_std::allocator<(anonymous_namespace)::ToolchainVariable>_>
        ::vector((vector<(anonymous_namespace)::ToolchainVariable,_std::allocator<(anonymous_namespace)::ToolchainVariable>_>
                  *)(anonymous_namespace)::Toolchains::DumpToolchain(std::__cxx11::string_const&)::
                    CompilerVariables,__l,(allocator_type *)0x52454c49504d4f43);
        lVar4 = 0xd8;
        do {
          anon_unknown.dwarf_150d466::ToolchainVariable::~ToolchainVariable
                    ((ToolchainVariable *)(local_1c0 + lVar4));
          lVar4 = lVar4 + -0x48;
        } while (lVar4 != -0x48);
        __cxa_atexit(std::
                     vector<(anonymous_namespace)::ToolchainVariable,_std::allocator<(anonymous_namespace)::ToolchainVariable>_>
                     ::~vector,
                     (anonymous_namespace)::Toolchains::DumpToolchain(std::__cxx11::string_const&)::
                     CompilerVariables,&__dso_handle);
        __cxa_guard_release(&(anonymous_namespace)::Toolchains::
                             DumpToolchain(std::__cxx11::string_const&)::CompilerVariables);
      }
      if (((anonymous_namespace)::Toolchains::DumpToolchain(std::__cxx11::string_const&)::
           CompilerImplicitVariables == '\0') &&
         (iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::Toolchains::
                                       DumpToolchain(std::__cxx11::string_const&)::
                                       CompilerImplicitVariables), iVar2 != 0)) {
        local_1c0._0_8_ = local_1c0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"includeDirectories","")
        ;
        local_1a0._M_p = (pointer)&local_190;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1a0,"IMPLICIT_INCLUDE_DIRECTORIES","");
        local_180 = true;
        local_178 = &local_168;
        uStack_160 = 0x736569726f7463;
        local_168 = 0x696c;
        uStack_166 = 0x6e;
        uStack_165 = 0x7269446b;
        uStack_161 = 0x65;
        local_170 = 0xf;
        local_159 = 0;
        local_158 = &local_148;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_158,"IMPLICIT_LINK_DIRECTORIES","");
        local_138 = 1;
        local_130 = &local_120;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_130,"linkFrameworkDirectories","");
        local_110[0] = local_100;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_110,"IMPLICIT_LINK_FRAMEWORK_DIRECTORIES","");
        local_f0 = 1;
        __a = (allocator_type *)0x7262694c6b6e696c;
        local_e0 = 0xd;
        local_cb = 0;
        local_e8 = local_d8;
        local_c8 = &local_b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c8,"IMPLICIT_LINK_LIBRARIES","");
        local_a9 = CONCAT11(1,(undefined1)local_a9);
        __l_00._M_len = extraout_RDX_00;
        __l_00._M_array = (iterator)local_1c0;
        std::
        vector<(anonymous_namespace)::ToolchainVariable,_std::allocator<(anonymous_namespace)::ToolchainVariable>_>
        ::vector((vector<(anonymous_namespace)::ToolchainVariable,_std::allocator<(anonymous_namespace)::ToolchainVariable>_>
                  *)(anonymous_namespace)::Toolchains::DumpToolchain(std::__cxx11::string_const&)::
                    CompilerImplicitVariables,__l_00,__a);
        lVar4 = 0xd8;
        do {
          anon_unknown.dwarf_150d466::ToolchainVariable::~ToolchainVariable
                    ((ToolchainVariable *)(local_1c0 + lVar4));
          lVar4 = lVar4 + -0x48;
        } while (lVar4 != -0x48);
        __cxa_atexit(std::
                     vector<(anonymous_namespace)::ToolchainVariable,_std::allocator<(anonymous_namespace)::ToolchainVariable>_>
                     ::~vector,
                     (anonymous_namespace)::Toolchains::DumpToolchain(std::__cxx11::string_const&)::
                     CompilerImplicitVariables,&__dso_handle);
        __cxa_guard_release(&(anonymous_namespace)::Toolchains::
                             DumpToolchain(std::__cxx11::string_const&)::CompilerImplicitVariables);
      }
      if (((anonymous_namespace)::Toolchains::DumpToolchain(std::__cxx11::string_const&)::
           SourceFileExtensionsVariable == '\0') &&
         (iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::Toolchains::
                                       DumpToolchain(std::__cxx11::string_const&)::
                                       SourceFileExtensionsVariable), iVar2 != 0)) {
        (anonymous_namespace)::Toolchains::DumpToolchain(std::__cxx11::string_const&)::
        SourceFileExtensionsVariable = &DAT_009bba38;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)
                   &(anonymous_namespace)::Toolchains::DumpToolchain(std::__cxx11::string_const&)::
                    SourceFileExtensionsVariable,"sourceFileExtensions","");
        _DAT_009bba48 = &DAT_009bba58;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&DAT_009bba48,"SOURCE_FILE_EXTENSIONS","");
        DAT_009bba68 = 1;
        __cxa_atexit(anon_unknown.dwarf_150d466::ToolchainVariable::~ToolchainVariable,
                     &(anonymous_namespace)::Toolchains::DumpToolchain(std::__cxx11::string_const&)
                      ::SourceFileExtensionsVariable,&__dso_handle);
        __cxa_guard_release(&(anonymous_namespace)::Toolchains::
                             DumpToolchain(std::__cxx11::string_const&)::
                             SourceFileExtensionsVariable);
      }
      puVar1 = *(undefined8 **)
                &(((fileAPI->CMakeInstance->GlobalGenerator)._M_t.
                   super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                   .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl)->Makefiles).
                 super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
      ;
      Json::Value::Value((Value *)&stack0xffffffffffffffa8,objectValue);
      Json::Value::Value((Value *)local_1c0,(String *)mf);
      pVVar3 = Json::Value::operator[]((Value *)&stack0xffffffffffffffa8,"language");
      Json::Value::operator=(pVVar3,(Value *)local_1c0);
      Json::Value::~Value((Value *)local_1c0);
      anon_unknown.dwarf_150d466::Toolchains::DumpToolchainVariables
                ((Value *)local_1c0,(Toolchains *)*puVar1,mf,
                 (string *)
                 (anonymous_namespace)::Toolchains::DumpToolchain(std::__cxx11::string_const&)::
                 CompilerVariables,in_R8);
      pVVar3 = Json::Value::operator[]((Value *)&stack0xffffffffffffffa8,"compiler");
      Json::Value::operator=(pVVar3,(Value *)local_1c0);
      Json::Value::~Value((Value *)local_1c0);
      anon_unknown.dwarf_150d466::Toolchains::DumpToolchainVariables
                ((Value *)local_1c0,(Toolchains *)*puVar1,mf,
                 (string *)
                 (anonymous_namespace)::Toolchains::DumpToolchain(std::__cxx11::string_const&)::
                 CompilerImplicitVariables,in_R8);
      pVVar3 = Json::Value::operator[]((Value *)&stack0xffffffffffffffa8,"compiler");
      pVVar3 = Json::Value::operator[](pVVar3,"implicit");
      Json::Value::operator=(pVVar3,(Value *)local_1c0);
      Json::Value::~Value((Value *)local_1c0);
      in_R8 = (vector<(anonymous_namespace)::ToolchainVariable,_std::allocator<(anonymous_namespace)::ToolchainVariable>_>
               *)&(anonymous_namespace)::Toolchains::DumpToolchain(std::__cxx11::string_const&)::
                  SourceFileExtensionsVariable;
      anon_unknown.dwarf_150d466::Toolchains::DumpToolchainVariable
                ((Toolchains *)*puVar1,(cmMakefile *)&stack0xffffffffffffffa8,
                 (Value *)(mf->FindPackageRootPathStack).
                          super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_map,
                 (string *)
                 (mf->FindPackageRootPathStack).
                 super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_map_size,
                 (ToolchainVariable *)
                 &(anonymous_namespace)::Toolchains::DumpToolchain(std::__cxx11::string_const&)::
                  SourceFileExtensionsVariable);
      Json::Value::append(&local_80,(Value *)&stack0xffffffffffffffa8);
      Json::Value::~Value((Value *)&stack0xffffffffffffffa8);
      mf = (cmMakefile *)
           &(mf->FindPackageRootPathStack).
            super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_last;
    } while (mf != local_a0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  pVVar3 = Json::Value::operator[](__return_storage_ptr__,"toolchains");
  Json::Value::operator=(pVVar3,&local_80);
  Json::Value::~Value(&local_80);
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmFileAPIToolchainsDump(cmFileAPI& fileAPI, unsigned long version)
{
  Toolchains toolchains(fileAPI, version);
  return toolchains.Dump();
}